

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

wchar_t mean(wchar_t *nums,wchar_t size,my_rational *frac)

{
  uint16_t uVar1;
  wchar_t wVar2;
  uint uVar3;
  size_t sVar4;
  my_rational mVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint16_t q [2];
  uint16_t r [4];
  uint16_t sz [2];
  uint16_t sn [4];
  uint16_t sp [4];
  uint16_t w [3];
  
  if (size < L'\x01') {
    wVar2 = L'\0';
    if (frac != (my_rational *)0x0) {
      frac->n = 0;
      frac->d = 1;
    }
  }
  else {
    uVar7 = 0;
    sp[0] = 0;
    sp[1] = 0;
    sp[2] = 0;
    sp[3] = 0;
    sn[0] = 0;
    sn[1] = 0;
    sn[2] = 0;
    sn[3] = 0;
    do {
      wVar2 = nums[uVar7];
      if (wVar2 != L'\0') {
        if (wVar2 < L'\x01') {
          uVar8 = (wVar2 ^ 0x7fffffffU) + 0x80000001;
          r._0_4_ = uVar8 >> 0x10 | uVar8 * 0x10000;
          uVar1 = addip_u16n(sn,r,4,2);
          if (uVar1 != 0) {
            __assert_fail("carry == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x59f,"int mean(const int *, int, struct my_rational *)");
          }
        }
        else {
          r._0_4_ = (uint)wVar2 >> 0x10 | wVar2 << 0x10;
          uVar1 = addip_u16n(sp,r,4,2);
          if (uVar1 != 0) {
            __assert_fail("carry == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x59c,"int mean(const int *, int, struct my_rational *)");
          }
        }
      }
      uVar7 = uVar7 + 1;
    } while ((uint)size != uVar7);
    sz = (uint16_t  [2])((uint)size >> 0x10 | size << 0x10);
    wVar2 = cmp_u16n(sp,sn,4,4);
    if (wVar2 < L'\0') {
      subip_u16n(sn,sp,4,4);
      wVar2 = div_u16n(q,r,w,sn,sz,2,4,2);
      if (wVar2 != L'\0') {
        __assert_fail("i == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x5a8,"int mean(const int *, int, struct my_rational *)");
      }
      sVar4 = msb_u16n(q,2);
      if (0x20 < sVar4) {
        __assert_fail("msb_u16n(q, N_ELEMENTS(q)) <= CHAR_BIT * sizeof(unsigned int)",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x5aa,"int mean(const int *, int, struct my_rational *)");
      }
      uVar8 = CONCAT22(q[0],q[1]);
      if (0x80000000 < uVar8) {
        __assert_fail("result <= abs_int_min",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x5ac,"int mean(const int *, int, struct my_rational *)");
      }
      wVar2 = cmp_u16n(sz,r,2,4);
      if (wVar2 < L'\x01') {
        __assert_fail("cmp_u16n(sz, r, N_ELEMENTS(sz), N_ELEMENTS(r)) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x5ad,"int mean(const int *, int, struct my_rational *)");
      }
      mVar5 = my_rational_construct(CONCAT22(r[2],r[3]),size);
      uVar6 = mVar5.d;
      uVar3 = mVar5.n;
      if (frac == (my_rational *)0x0) {
        if (uVar6 + 1 >> 1 <= uVar3) {
          if ((int)((uint)q[0] << 0x10) < 0) {
            __assert_fail("result < abs_int_min",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x5c1,"int mean(const int *, int, struct my_rational *)");
          }
          uVar8 = uVar8 + 1;
        }
      }
      else {
        if (uVar3 == 0) {
          frac->n = 0;
        }
        else {
          if ((int)((uint)q[0] << 0x10) < 0) {
            __assert_fail("result < abs_int_min",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x5b6,"int mean(const int *, int, struct my_rational *)");
          }
          if (uVar6 < uVar3 || uVar6 - uVar3 == 0) {
            __assert_fail("f.n < f.d",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x5b8,"int mean(const int *, int, struct my_rational *)");
          }
          uVar8 = uVar8 + 1;
          frac->n = uVar6 - uVar3;
        }
        frac->d = uVar6;
      }
      wVar2 = -uVar8;
    }
    else {
      subip_u16n(sp,sn,4,4);
      wVar2 = div_u16n(q,r,w,sp,sz,2,4,2);
      if (wVar2 != L'\0') {
        __assert_fail("i == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x5ca,"int mean(const int *, int, struct my_rational *)");
      }
      sVar4 = msb_u16n(q,2);
      if (0x20 < sVar4) {
        __assert_fail("msb_u16n(q, N_ELEMENTS(q)) <= CHAR_BIT * sizeof(unsigned int)",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x5cb,"int mean(const int *, int, struct my_rational *)");
      }
      if ((int)((uint)q[0] << 0x10) < 0) {
        __assert_fail("result <= INT_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x5cd,"int mean(const int *, int, struct my_rational *)");
      }
      wVar2 = cmp_u16n(sz,r,2,4);
      if (wVar2 < L'\x01') {
        __assert_fail("cmp_u16n(sz, r, N_ELEMENTS(sz), N_ELEMENTS(r)) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x5ce,"int mean(const int *, int, struct my_rational *)");
      }
      wVar2 = CONCAT22(q[0],q[1]);
      mVar5 = my_rational_construct(CONCAT22(r[2],r[3]),size);
      if (frac == (my_rational *)0x0) {
        if (mVar5.d + 1 >> 1 <= mVar5.n) {
          if (wVar2 == L'\x7fffffff') {
            __assert_fail("result < INT_MAX",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x5d5,"int mean(const int *, int, struct my_rational *)");
          }
          wVar2 = wVar2 + L'\x01';
        }
      }
      else {
        frac->n = mVar5.n;
        frac->d = mVar5.d;
      }
    }
  }
  return wVar2;
}

Assistant:

int mean(const int *nums, int size, struct my_rational *frac)
{
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
	/* Holds the absolute value of INT_MIN in an unsigned int. */
	unsigned int abs_int_min = (unsigned int)(-(INT_MIN + 1)) + 1;
	/*
	 * Store the positive constructions to sum(nums[i]) in sp and the
	 * negative contributions to sum(nums[i]) in sn.
	 */
	uint16_t sp[2 * MP_DIGITS], sn[2 * MP_DIGITS];
	uint16_t q[MP_DIGITS], r[2 * MP_DIGITS], w[MP_DIGITS + 1];
	uint16_t sz[MP_DIGITS];
	struct my_rational f;
	unsigned int result;
	int i;
	/*
	 * Avoid compiler warnings about set but unused variables when
	 * assertions are stripped.
	 */
#ifndef NDEBUG
	bool over;
#define CHECK_OVERFLOW(x) over = x; assert(!over)
	uint16_t carry;
#define CHECK_CARRY(x) carry = x; assert(carry == 0)
#else
#define CHECK_OVERFLOW(x) x
#define CHECK_CARRY(x) x
#endif

	if (size <= 0) {
		if (frac) {
			*frac = my_rational_construct(0, 1);
		}
		return 0;
	}

	zer_u16n(sp, N_ELEMENTS(sp));
	zer_u16n(sn, N_ELEMENTS(sn));

	for (i = 0; i < size; ++i) {
		uint16_t v[MP_DIGITS];

		if (nums[i] == 0) {
			continue;
		}
		if (nums[i] > 0) {
			CHECK_OVERFLOW(ini_u16n(v, N_ELEMENTS(v), nums[i]));
			CHECK_CARRY(addip_u16n(sp, v, N_ELEMENTS(sp), N_ELEMENTS(v)));
		} else if (nums[i] < 0) {
			CHECK_OVERFLOW(ini_u16n(v, N_ELEMENTS(v), abs_int_min - (unsigned int)(nums[i] - INT_MIN)));
			CHECK_CARRY(addip_u16n(sn, v, N_ELEMENTS(sn), N_ELEMENTS(v)));
		}
	}

	CHECK_OVERFLOW(ini_u16n(sz, N_ELEMENTS(sz), size));
	if (cmp_u16n(sp, sn, N_ELEMENTS(sp), N_ELEMENTS(sn)) < 0) {
		subip_u16n(sn, sp, N_ELEMENTS(sn), N_ELEMENTS(sp));
		i = div_u16n(q, r, w, sn, sz, N_ELEMENTS(q), N_ELEMENTS(sn),
			N_ELEMENTS(sz));
		assert(i == 0);
		assert(msb_u16n(q, N_ELEMENTS(q))
			<= CHAR_BIT * sizeof(unsigned int));
		result = ext_u16n(q, N_ELEMENTS(q));
		assert(result <= abs_int_min);
		assert(cmp_u16n(sz, r, N_ELEMENTS(sz), N_ELEMENTS(r)) > 0);
		f = my_rational_construct(ext_u16n(r, N_ELEMENTS(r)), size);
		if (frac) {
			/*
			 * Will be negating m, but the returned fraction must
			 * be non-negative so increment m and replace the
			 * fractional part with (size - remainder) / size.
			 */
			if (f.n > 0) {
				assert(result < abs_int_min);
				++result;
				assert(f.n < f.d);
				frac->n = f.d - f.n;
				frac->d = f.d;
			} else {
				*frac = f;
			}
		} else {
			/* Round to nearest. */
			if (f.n >= (f.d + 1) / 2) {
				assert(result < abs_int_min);
				++result;
			}
		}
		return (result == 0) ?
			0 : INT_MIN + (int)(abs_int_min - result);
	}
	subip_u16n(sp, sn, N_ELEMENTS(sp), N_ELEMENTS(sn));
	i = div_u16n(q, r, w, sp, sz, N_ELEMENTS(q), N_ELEMENTS(sp), N_ELEMENTS(sz));
	assert(i == 0);
	assert(msb_u16n(q, N_ELEMENTS(q)) <= CHAR_BIT * sizeof(unsigned int));
	result = ext_u16n(q, N_ELEMENTS(q));
	assert(result <= INT_MAX);
	assert(cmp_u16n(sz, r, N_ELEMENTS(sz), N_ELEMENTS(r)) > 0);
	f = my_rational_construct(ext_u16n(r, N_ELEMENTS(r)), size);
	if (frac) {
		*frac = f;
	} else {
		/* Round to nearest. */
		if (f.n >= (f.d + 1) / 2) {
			assert(result < INT_MAX);
			++result;
		}
	}

	return result;
#undef MP_DIGITS
#undef CHECK_OVERFLOW
#undef CHECK_CARRY
}